

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasHeat2D_kry.c
# Opt level: O1

int main(void)

{
  uint uVar1;
  N_Vector uu;
  N_Vector up;
  N_Vector p_Var2;
  long lVar3;
  UserData data;
  N_Vector p_Var4;
  char *pcVar5;
  int iVar6;
  sunrealtype rtol;
  double dVar7;
  sunrealtype atol;
  void *mem;
  SUNContext ctx;
  long ncfl;
  long ncfn;
  long netf;
  sunrealtype tret;
  void *local_70;
  undefined8 local_68;
  double local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  sunrealtype local_40;
  N_Vector local_38;
  
  local_70 = (void *)0x0;
  uVar1 = SUNContext_Create(0,&local_68);
  if ((int)uVar1 < 0) {
    pcVar5 = "SUNContext_Create";
  }
  else {
    uu = (N_Vector)N_VNew_Serial(100,local_68);
    if (uu == (N_Vector)0x0) {
      main_cold_8();
      return 1;
    }
    up = (N_Vector)N_VClone(uu);
    if (up == (N_Vector)0x0) {
      main_cold_7();
      return 1;
    }
    p_Var2 = (N_Vector)N_VClone(uu);
    if (p_Var2 == (N_Vector)0x0) {
      main_cold_6();
      return 1;
    }
    lVar3 = N_VClone(uu);
    if (lVar3 == 0) {
      main_cold_5();
      return 1;
    }
    data = (UserData)malloc(0x20);
    data->pp = (N_Vector)0x0;
    if (data == (UserData)0x0) {
      main_cold_4();
      return 1;
    }
    data->mm = 10;
    data->dx = 0.1111111111111111;
    data->coeff = 81.0;
    p_Var4 = (N_Vector)N_VClone(uu);
    data->pp = p_Var4;
    if (p_Var4 == (N_Vector)0x0) {
      main_cold_3();
      return 1;
    }
    SetInitialProfile(data,uu,up,p_Var2);
    N_VConst(0x3ff0000000000000,lVar3);
    local_70 = (void *)IDACreate(local_68);
    if (local_70 == (void *)0x0) {
      main_cold_2();
      return 1;
    }
    uVar1 = IDASetUserData(local_70,data);
    if ((int)uVar1 < 0) {
      pcVar5 = "IDASetUserData";
    }
    else {
      uVar1 = IDASetConstraints(local_70,lVar3);
      if ((int)uVar1 < 0) {
        pcVar5 = "IDASetConstraints";
      }
      else {
        N_VDestroy(lVar3);
        uVar1 = IDAInit(0,local_70,resHeat,uu,up);
        if ((int)uVar1 < 0) {
          pcVar5 = "IDAInit";
        }
        else {
          atol = 0.001;
          uVar1 = IDASStolerances(0,local_70);
          if ((int)uVar1 < 0) {
            pcVar5 = "IDASStolerances";
          }
          else {
            lVar3 = SUNLinSol_SPGMR(uu,1,0,local_68);
            if (lVar3 == 0) {
              main_cold_1();
              return 1;
            }
            uVar1 = SUNLinSol_SPGMRSetMaxRestarts(lVar3,5);
            if ((int)uVar1 < 0) {
              pcVar5 = "SUNLinSol_SPGMRSetMaxRestarts";
            }
            else {
              uVar1 = IDASetLinearSolver(local_70,lVar3,0);
              if ((int)uVar1 < 0) {
                pcVar5 = "IDASetLinearSolver";
              }
              else {
                uVar1 = IDASetPreconditioner(local_70,PsetupHeat,PsolveHeat);
                if ((int)uVar1 < 0) {
                  pcVar5 = "IDASetPreconditioner";
                }
                else {
                  local_38 = p_Var2;
                  PrintHeader(rtol,atol);
                  puts("\n\nCase 1: gsytpe = SUN_MODIFIED_GS");
                  puts("\n   Output Summary (umax = max-norm of solution) \n");
                  puts("  time     umax       k  nst  nni  nje   nre   nreLS    h      npe nps");
                  puts("----------------------------------------------------------------------");
                  dVar7 = 0.01;
                  iVar6 = 0xb;
                  do {
                    local_60 = dVar7;
                    uVar1 = IDASolve(local_70,&local_40,uu,up,1);
                    if ((int)uVar1 < 0) goto LAB_001029e9;
                    PrintOutput(local_70,local_40,uu);
                    dVar7 = local_60 + local_60;
                    iVar6 = iVar6 + -1;
                  } while (iVar6 != 0);
                  uVar1 = IDAGetNumErrTestFails(local_70,&local_48);
                  if ((int)uVar1 < 0) {
                    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
                            "IDAGetNumErrTestFails",(ulong)uVar1);
                  }
                  uVar1 = IDAGetNumNonlinSolvConvFails(local_70,&local_50);
                  p_Var2 = local_38;
                  if ((int)uVar1 < 0) {
                    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
                            "IDAGetNumNonlinSolvConvFails",(ulong)uVar1);
                  }
                  uVar1 = IDAGetNumLinConvFails(local_70,&local_58);
                  if ((int)uVar1 < 0) {
                    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
                            "IDAGetNumLinConvFails",(ulong)uVar1);
                  }
                  printf("\nError test failures            = %ld\n",local_48);
                  printf("Nonlinear convergence failures = %ld\n",local_50);
                  printf("Linear convergence failures    = %ld\n",local_58);
                  SetInitialProfile(data,uu,up,p_Var2);
                  uVar1 = IDAReInit(0,local_70,uu,up);
                  if ((int)uVar1 < 0) {
                    pcVar5 = "IDAReInit";
                  }
                  else {
                    uVar1 = SUNLinSol_SPGMRSetGSType(lVar3,2);
                    if ((int)uVar1 < 0) {
                      pcVar5 = "SUNLinSol_SPGMRSetGSType";
                    }
                    else {
                      puts("\n\nCase 2: gstype = SUN_CLASSICAL_GS");
                      puts("\n   Output Summary (umax = max-norm of solution) \n");
                      puts("  time     umax       k  nst  nni  nje   nre   nreLS    h      npe nps")
                      ;
                      puts("----------------------------------------------------------------------")
                      ;
                      dVar7 = 0.01;
                      iVar6 = 0xb;
                      while (local_60 = dVar7, uVar1 = IDASolve(local_70,&local_40,uu,up,1),
                            -1 < (int)uVar1) {
                        PrintOutput(local_70,local_40,uu);
                        dVar7 = local_60 + local_60;
                        iVar6 = iVar6 + -1;
                        if (iVar6 == 0) {
                          uVar1 = IDAGetNumErrTestFails(local_70,&local_48);
                          if ((int)uVar1 < 0) {
                            fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
                                    "IDAGetNumErrTestFails",(ulong)uVar1);
                          }
                          uVar1 = IDAGetNumNonlinSolvConvFails(local_70,&local_50);
                          p_Var2 = local_38;
                          if ((int)uVar1 < 0) {
                            fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
                                    "IDAGetNumNonlinSolvConvFails",(ulong)uVar1);
                          }
                          uVar1 = IDAGetNumLinConvFails(local_70,&local_58);
                          if ((int)uVar1 < 0) {
                            fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
                                    "IDAGetNumLinConvFails",(ulong)uVar1);
                          }
                          printf("\nError test failures            = %ld\n",local_48);
                          printf("Nonlinear convergence failures = %ld\n",local_50);
                          printf("Linear convergence failures    = %ld\n",local_58);
                          IDAFree(&local_70);
                          SUNLinSolFree(lVar3);
                          N_VDestroy(uu);
                          N_VDestroy(up);
                          N_VDestroy(p_Var2);
                          N_VDestroy(data->pp);
                          free(data);
                          SUNContext_Free(&local_68);
                          return 0;
                        }
                      }
LAB_001029e9:
                      pcVar5 = "IDASolve";
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar5,(ulong)uVar1);
  return 1;
}

Assistant:

int main(void)
{
  void* mem;
  UserData data;
  N_Vector uu, up, constraints, res;
  int retval, iout;
  sunrealtype rtol, atol, t0, t1, tout, tret;
  long int netf, ncfn, ncfl;
  SUNLinearSolver LS;
  SUNContext ctx;

  mem  = NULL;
  data = NULL;
  uu = up = constraints = res = NULL;
  LS                          = NULL;

  /* Create the SUNDIALS context object for this simulation */

  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* Allocate N-vectors and the user data structure. */

  uu = N_VNew_Serial(NEQ, ctx);
  if (check_retval((void*)uu, "N_VNew_Serial", 0)) { return (1); }

  up = N_VClone(uu);
  if (check_retval((void*)up, "N_VNew_Serial", 0)) { return (1); }

  res = N_VClone(uu);
  if (check_retval((void*)res, "N_VNew_Serial", 0)) { return (1); }

  constraints = N_VClone(uu);
  if (check_retval((void*)constraints, "N_VNew_Serial", 0)) { return (1); }

  data     = (UserData)malloc(sizeof *data);
  data->pp = NULL;
  if (check_retval((void*)data, "malloc", 2)) { return (1); }

  /* Assign parameters in the user data structure. */

  data->mm    = MGRID;
  data->dx    = ONE / (MGRID - ONE);
  data->coeff = ONE / (data->dx * data->dx);
  data->pp    = N_VClone(uu);
  if (check_retval((void*)data->pp, "N_VNew_Serial", 0)) { return (1); }

  /* Initialize uu, up. */

  SetInitialProfile(data, uu, up, res);

  /* Set constraints to all 1's for nonnegative solution values. */

  N_VConst(ONE, constraints);

  /* Assign various parameters. */

  t0   = ZERO;
  t1   = SUN_RCONST(0.01);
  rtol = ZERO;
  atol = SUN_RCONST(1.0e-3);

  /* Call IDACreate and IDAMalloc to initialize solution */

  mem = IDACreate(ctx);
  if (check_retval((void*)mem, "IDACreate", 0)) { return (1); }

  retval = IDASetUserData(mem, data);
  if (check_retval(&retval, "IDASetUserData", 1)) { return (1); }

  retval = IDASetConstraints(mem, constraints);
  if (check_retval(&retval, "IDASetConstraints", 1)) { return (1); }
  N_VDestroy(constraints);

  retval = IDAInit(mem, resHeat, t0, uu, up);
  if (check_retval(&retval, "IDAInit", 1)) { return (1); }

  retval = IDASStolerances(mem, rtol, atol);
  if (check_retval(&retval, "IDASStolerances", 1)) { return (1); }

  /* Create the linear solver SUNLinSol_SPGMR with left preconditioning
     and the default Krylov dimension */
  LS = SUNLinSol_SPGMR(uu, SUN_PREC_LEFT, 0, ctx);
  if (check_retval((void*)LS, "SUNLinSol_SPGMR", 0)) { return (1); }

  /* IDA recommends allowing up to 5 restarts (default is 0) */
  retval = SUNLinSol_SPGMRSetMaxRestarts(LS, 5);
  if (check_retval(&retval, "SUNLinSol_SPGMRSetMaxRestarts", 1)) { return (1); }

  /* Attach the linear sovler */
  retval = IDASetLinearSolver(mem, LS, NULL);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  /* Set the preconditioner solve and setup functions */
  retval = IDASetPreconditioner(mem, PsetupHeat, PsolveHeat);
  if (check_retval(&retval, "IDASetPreconditioner", 1)) { return (1); }

  /* Print output heading. */
  PrintHeader(rtol, atol);

  /*
   * -------------------------------------------------------------------------
   * CASE I
   * -------------------------------------------------------------------------
   */

  /* Print case number, output table heading, and initial line of table. */

  printf("\n\nCase 1: gsytpe = SUN_MODIFIED_GS\n");
  printf("\n   Output Summary (umax = max-norm of solution) \n\n");
  printf(
    "  time     umax       k  nst  nni  nje   nre   nreLS    h      npe nps\n");
  printf(
    "----------------------------------------------------------------------\n");

  /* Loop over output times, call IDASolve, and print results. */

  for (tout = t1, iout = 1; iout <= NOUT; iout++, tout *= TWO)
  {
    retval = IDASolve(mem, tout, &tret, uu, up, IDA_NORMAL);
    if (check_retval(&retval, "IDASolve", 1)) { return (1); }
    PrintOutput(mem, tret, uu);
  }

  /* Print remaining counters. */

  retval = IDAGetNumErrTestFails(mem, &netf);
  check_retval(&retval, "IDAGetNumErrTestFails", 1);

  retval = IDAGetNumNonlinSolvConvFails(mem, &ncfn);
  check_retval(&retval, "IDAGetNumNonlinSolvConvFails", 1);

  retval = IDAGetNumLinConvFails(mem, &ncfl);
  check_retval(&retval, "IDAGetNumLinConvFails", 1);

  printf("\nError test failures            = %ld\n", netf);
  printf("Nonlinear convergence failures = %ld\n", ncfn);
  printf("Linear convergence failures    = %ld\n", ncfl);

  /*
   * -------------------------------------------------------------------------
   * CASE II
   * -------------------------------------------------------------------------
   */

  /* Re-initialize uu, up. */

  SetInitialProfile(data, uu, up, res);

  /* Re-initialize IDA and SPGMR */

  retval = IDAReInit(mem, t0, uu, up);
  if (check_retval(&retval, "IDAReInit", 1)) { return (1); }

  retval = SUNLinSol_SPGMRSetGSType(LS, SUN_CLASSICAL_GS);
  if (check_retval(&retval, "SUNLinSol_SPGMRSetGSType", 1)) { return (1); }

  /* Print case number, output table heading, and initial line of table. */

  printf("\n\nCase 2: gstype = SUN_CLASSICAL_GS\n");
  printf("\n   Output Summary (umax = max-norm of solution) \n\n");
  printf(
    "  time     umax       k  nst  nni  nje   nre   nreLS    h      npe nps\n");
  printf(
    "----------------------------------------------------------------------\n");

  /* Loop over output times, call IDASolve, and print results. */

  for (tout = t1, iout = 1; iout <= NOUT; iout++, tout *= TWO)
  {
    retval = IDASolve(mem, tout, &tret, uu, up, IDA_NORMAL);
    if (check_retval(&retval, "IDASolve", 1)) { return (1); }
    PrintOutput(mem, tret, uu);
  }

  /* Print remaining counters. */

  retval = IDAGetNumErrTestFails(mem, &netf);
  check_retval(&retval, "IDAGetNumErrTestFails", 1);

  retval = IDAGetNumNonlinSolvConvFails(mem, &ncfn);
  check_retval(&retval, "IDAGetNumNonlinSolvConvFails", 1);

  retval = IDAGetNumLinConvFails(mem, &ncfl);
  check_retval(&retval, "IDAGetNumLinConvFails", 1);

  printf("\nError test failures            = %ld\n", netf);
  printf("Nonlinear convergence failures = %ld\n", ncfn);
  printf("Linear convergence failures    = %ld\n", ncfl);

  /* Free Memory */

  IDAFree(&mem);
  SUNLinSolFree(LS);

  N_VDestroy(uu);
  N_VDestroy(up);
  N_VDestroy(res);

  N_VDestroy(data->pp);
  free(data);
  SUNContext_Free(&ctx);

  return (0);
}